

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.cc
# Opt level: O1

DVector * fizplex::operator*(DVector *__return_storage_ptr__,double c,DVector *vec)

{
  double dVar1;
  size_t sVar2;
  double *pdVar3;
  size_t i;
  
  sVar2 = vec->dim;
  if (sVar2 == (vec->vals)._M_size) {
    (__return_storage_ptr__->vals)._M_size = sVar2;
    pdVar3 = (double *)operator_new(sVar2 * 8);
    (__return_storage_ptr__->vals)._M_data = pdVar3;
    memset(pdVar3,0,sVar2 * 8);
    __return_storage_ptr__->dim = sVar2;
    if (sVar2 != 0) {
      i = 0;
      do {
        pdVar3 = DVector::operator[](vec,i);
        dVar1 = *pdVar3;
        pdVar3 = DVector::operator[](__return_storage_ptr__,i);
        *pdVar3 = dVar1 * c;
        i = i + 1;
      } while (sVar2 != i);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("dim == vals.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/dvector.cc"
                ,0xb,"const size_t &fizplex::DVector::dimension() const");
}

Assistant:

DVector operator*(const double c, const DVector &vec) {
  size_t dim = vec.dimension();
  DVector result(dim);
  for (size_t i = 0; i < dim; i++)
    result[i] = c * vec[i];
  return result;
}